

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExistingFileNamer.cpp
# Opt level: O2

void __thiscall
ApprovalTests::ExistingFileNamer::ExistingFileNamer
          (ExistingFileNamer *this,string *filePath_,Options *options)

{
  (this->super_ApprovalNamer)._vptr_ApprovalNamer = (_func_int **)&PTR__ExistingFileNamer_001bc648;
  ::std::__cxx11::string::string((string *)&this->filePath,(string *)filePath_);
  this->options_ = options;
  return;
}

Assistant:

ExistingFileNamer::ExistingFileNamer(std::string filePath_, const Options& options)
        : filePath(std::move(filePath_)), options_(options)
    {
    }